

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_title_screen.hpp
# Opt level: O0

uint32_t PatchTitleScreen::inject_pointer_func(ROM *rom,uint32_t pointed_addr)

{
  uint32_t uVar1;
  allocator<char> local_e1;
  string local_e0;
  AddressRegister local_c0 [2];
  AddressRegister local_a0;
  undefined1 local_90 [8];
  Code pointer_func;
  uint32_t pointed_addr_local;
  ROM *rom_local;
  
  pointer_func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = pointed_addr;
  md::Code::Code((Code *)local_90);
  uVar1 = pointer_func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  md::AddressRegister::AddressRegister(&local_a0,'\0');
  md::Code::lea((Code *)local_90,uVar1,&local_a0);
  md::AddressRegister::AddressRegister(local_c0,'\x01');
  md::Code::lea((Code *)local_90,0xff2c00,local_c0);
  md::Code::rts((Code *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e1);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_90,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  md::Code::~Code((Code *)local_90);
  return uVar1;
}

Assistant:

static uint32_t inject_pointer_func(md::ROM& rom, uint32_t pointed_addr)
    {
        md::Code pointer_func;
        {
            pointer_func.lea(pointed_addr, reg_A0);
            pointer_func.lea(0x00FF2C00, reg_A1);
        }
        pointer_func.rts();

        return rom.inject_code(pointer_func);
    }